

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O1

err_t ReadData(ebml_master *Element,stream *Input,ebml_parser_context *ParserContext,
              bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  stream *psVar5;
  size_t sVar6;
  ebml_crc *peVar7;
  filepos_t fVar8;
  long lVar9;
  ebml_crc *Element_00;
  bool_t bVar10;
  filepos_t fVar11;
  ebml_context *Context_00;
  stream *Input_00;
  stream *psVar12;
  bool bVar13;
  int UpperEltFound;
  uint8_t *CRCData;
  filepos_t OffSet;
  ebml_parser_context Context;
  int local_ac;
  ebml_crc *local_a8;
  char *local_a0;
  size_t local_98;
  stream *local_90;
  array local_88;
  filepos_t local_78;
  long local_70;
  int local_64;
  size_t local_60;
  long local_58;
  ebml_parser_context local_50;
  
  local_ac = 0;
  local_a0 = (char *)0x0;
  local_90 = Input;
  local_60 = DepthCheckCRC;
  NodeTree_Clear((nodetree *)Element);
  (Element->Base).bValueIsSet = '\0';
  if ((Element->Base).DataSize < 1) {
    bVar10 = EBML_ElementIsFiniteSize(&Element->Base);
    Element_00 = (ebml_crc *)0x0;
    local_a8 = (ebml_crc *)0x0;
    local_98 = 0;
    Input_00 = local_90;
    if (bVar10 != 0) goto LAB_001136f6;
  }
  Input_00 = local_90;
  if (local_90 == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x123,
                  "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                 );
  }
  pcVar2 = *(code **)((long)(local_90->Base).VMT + 0x78);
  fVar8 = EBML_ElementPositionData(&Element->Base);
  local_a8 = (ebml_crc *)0x0;
  lVar9 = (*pcVar2)(Input_00,fVar8,0);
  if (lVar9 == -1) {
    bVar4 = true;
    Element_00 = (ebml_crc *)0x0;
    local_98 = 0;
  }
  else {
    local_78 = (Element->Base).DataSize;
    local_50.Context = (Element->Base).Context;
    local_64 = Scope;
    local_50.UpContext = ParserContext;
    local_50.EndPosition = EBML_ElementPositionEnd(&Element->Base);
    local_50.Profile = ParserContext->Profile;
    Element_00 = (ebml_crc *)EBML_FindNextElement(Input_00,&local_50,&local_ac,AllowDummyElt);
    if ((Element_00 != (ebml_crc *)0x0) && (local_ac < 1)) {
      local_98 = 0;
      local_58 = local_60 - 1;
      if (local_60 == 0) {
        local_58 = 0;
      }
      bVar3 = true;
      local_a8 = (ebml_crc *)0x0;
      do {
        bVar10 = EBML_ElementIsFiniteSize(&Element->Base);
        if (bVar10 != 0) {
          fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
          fVar11 = EBML_ElementPositionEnd(&Element->Base);
          if (fVar11 < fVar8) goto LAB_001136e9;
        }
        if ((AllowDummyElt == 0) && (bVar10 = EBML_ElementIsDummy(&Element_00->Base), bVar10 != 0))
        {
          EBML_ElementSkipData(&Element_00->Base,Input_00,&local_50,(ebml_element *)0x0,0);
LAB_0011347f:
          NodeDelete((node *)Element_00);
          Element_00 = (ebml_crc *)0x0;
        }
        else {
          iVar1 = local_64;
          lVar9 = (**(code **)((long)(Element_00->Base).Base.Base.VMT + 0x78))
                            (Element_00,Input_00,&local_50,AllowDummyElt,local_64,local_58);
          if (lVar9 != 0) goto LAB_0011347f;
          if (((iVar1 != 2) && (local_60 != 0)) && (bVar3)) {
            Context_00 = EBML_getContextEbmlCrc32();
            bVar10 = EBML_ElementIsType(&Element_00->Base,Context_00);
            bVar3 = true;
            if (local_a8 == (ebml_crc *)0x0 && bVar10 != 0) {
              bVar10 = EBML_ElementIsFiniteSize(&Element->Base);
              psVar5 = local_90;
              psVar12 = Input_00;
              if (bVar10 == 0) {
LAB_0011359f:
                local_a8 = (ebml_crc *)0x0;
                Input_00 = psVar12;
                peVar7 = local_a8;
              }
              else {
                bVar10 = Node_IsPartOf(local_90,0x534d454d);
                peVar7 = Element_00;
                if (bVar10 == 0) {
                  local_88._Begin = (char *)0x0;
                  local_88._Used = 0;
                  fVar8 = EBML_ElementPositionEnd(&Element->Base);
                  fVar11 = EBML_ElementPositionEnd(&Element_00->Base);
                  if (fVar8 - fVar11 != 0xffffffffffffffff) {
                    bVar10 = ArrayResize(&local_88,fVar8 - fVar11,0);
                    sVar6 = local_88._Used;
                    bVar3 = false;
                    local_a8 = Element_00;
                    if (bVar10 == 0) goto LAB_001135aa;
                    local_a0 = local_88._Begin;
                    Input_00 = (stream *)NodeCreate(Element,0x534d454d);
                    local_98 = sVar6;
                    if (Input_00 == (stream *)0x0) {
                      ArrayClear(&local_88);
                      Input_00 = local_90;
                    }
                    else {
                      local_70 = EBML_ElementPositionEnd(&Element_00->Base);
                      (**(code **)((long)(Input_00->Base).VMT + 0x20))
                                (Input_00,0x100,local_a0,sVar6);
                      (**(code **)((long)(Input_00->Base).VMT + 0x20))(Input_00,0x102,&local_70);
                      psVar12 = local_90;
                      local_a8 = *(ebml_crc **)((long)(local_90->Base).VMT + 0x78);
                      fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
                      (*(code *)local_a8)(psVar12,fVar8,0);
                      lVar9 = (**(code **)((long)(psVar12->Base).VMT + 0x58))
                                        (psVar12,local_a0,sVar6);
                      if (lVar9 != 0) {
                        StreamClose(Input_00);
                        ArrayClear(&local_88);
                        local_a0 = (char *)0x0;
                        goto LAB_0011359f;
                      }
                    }
                  }
                }
                else {
                  pcVar2 = *(code **)((long)(psVar5->Base).VMT + 0x78);
                  fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
                  lVar9 = (*pcVar2)(psVar5,fVar8,0);
                  (**(code **)((long)(psVar5->Base).VMT + 0x18))(psVar5,0x102,&local_70,8);
                  (**(code **)((long)(psVar5->Base).VMT + 0x18))(psVar5,0x101,&local_a0);
                  local_a0 = local_a0 + (lVar9 - local_70);
                  fVar8 = EBML_ElementDataSize(&Element->Base,1);
                  fVar11 = EBML_ElementFullSize(&Element_00->Base,1);
                  local_98 = fVar8 - fVar11;
                  (**(code **)((long)(psVar5->Base).VMT + 0x58))(psVar5,local_a0,local_98);
                }
              }
              local_a8 = peVar7;
              bVar3 = false;
            }
          }
LAB_001135aa:
          if (local_a8 != Element_00) {
            EBML_MasterAppend(Element,&Element_00->Base);
          }
          EBML_ElementSkipData
                    (&Element_00->Base,Input_00,&local_50,(ebml_element *)0x0,AllowDummyElt);
        }
        if (Element_00 != (ebml_crc *)0x0) {
          fVar8 = EBML_ElementPositionEnd(&Element->Base);
          local_78 = EBML_ElementPositionEnd(&Element_00->Base);
          local_78 = fVar8 - local_78;
        }
        if (local_ac < 1) {
          if (((local_ac < 0) && (local_ac = local_ac + 1, local_ac != 0)) ||
             ((bVar10 = EBML_ElementIsFiniteSize(&Element->Base), bVar10 != 0 && (local_78 < 1)))) {
            bVar4 = false;
            goto LAB_001136ec;
          }
          Element_00 = (ebml_crc *)EBML_FindNextElement(Input_00,&local_50,&local_ac,AllowDummyElt);
        }
        else {
          iVar1 = local_ac + -1;
          bVar4 = false;
          bVar13 = local_ac != 1;
          local_ac = iVar1;
          if ((bVar13) ||
             ((bVar10 = EBML_ElementIsFiniteSize(&Element->Base), bVar10 != 0 && (local_78 < 1))))
          goto LAB_001136ec;
        }
        bVar4 = false;
        if ((Element_00 == (ebml_crc *)0x0) || (0 < local_ac)) goto LAB_001136ec;
      } while( true );
    }
    local_98 = 0;
LAB_001136e9:
    bVar4 = false;
  }
LAB_001136ec:
  if (bVar4) {
    return -9;
  }
LAB_001136f6:
  peVar7 = local_a8;
  if (local_a0 != (char *)0x0) {
    bVar10 = EBML_CRCMatches(local_a8,local_a0,local_98);
    Element->CheckSumStatus = 2 - (uint)(bVar10 == 0);
    NodeDelete((node *)peVar7);
    if (local_a0 == local_88._Begin) {
      StreamClose(Input_00);
      ArrayClear(&local_88);
    }
  }
  (Element->Base).bValueIsSet = '\x01';
  if (0 < local_ac) {
    if (Element_00 == (ebml_crc *)0x0) {
      __assert_fail("SubElement!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a0,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    if (local_90 == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a1,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    (**(code **)((long)(local_90->Base).VMT + 0x78))(local_90,(Element_00->Base).ElementPosition,0);
    NodeDelete((node *)Element_00);
  }
  return 0;
}

Assistant:

static err_t ReadData(ebml_string *Element, struct stream *Input, const ebml_parser_context *UNUSED_PARAM(ParserContext), bool_t UNUSED_PARAM(AllowDummyElt), int Scope, size_t UNUSED_PARAM(DepthCheckCRC))
{
    err_t Result;
    char *Buffer = NULL;

    Element->Base.bValueIsSet = 0;

    if (Scope == SCOPE_NO_DATA)
        return ERR_NONE;

    if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
    {
        Result = ERR_READ;
        goto failed;
    }
#if MAX_FILEPOS >= SIZE_MAX
    if ((filepos_t)Element->Base.DataSize > (filepos_t)(SIZE_MAX - 1))
#else
    if ((size_t)Element->Base.DataSize > (size_t)(SIZE_MAX - 1))
#endif
    {
        Result = ERR_OUT_OF_MEMORY;
        goto failed;
    }

    Buffer = malloc((size_t)Element->Base.DataSize+1);
    if (!Buffer)
        return ERR_OUT_OF_MEMORY;

    Result = Stream_Read(Input,Buffer,(size_t)Element->Base.DataSize,NULL);
    if (Result != ERR_NONE)
        goto failed;

    Buffer[Element->Base.DataSize] = 0;
    Element->Buffer = Buffer;
    Element->Base.bValueIsSet = 1;
    return ERR_NONE;

failed:
    free(Buffer);
    Element->Buffer = NULL;
    return Result;
}